

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

void __thiscall GlobOpt::GenerateLoopCount(GlobOpt *this,Loop *loop,LoopCount *loopCount)

{
  BailOutInfo *bailOutInfo;
  Instr *instr;
  Func *func;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  BailOutInstrTemplate<IR::Instr> *pBVar7;
  RegOpnd *pRVar8;
  StackSym *pSVar9;
  Instr *this_00;
  IntConstOpnd *newSrc;
  IntConstOpnd *local_38;
  
  bVar3 = DoLoopCountBasedBoundCheckHoist(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x693,"(DoLoopCountBasedBoundCheckHoist())",
                       "DoLoopCountBasedBoundCheckHoist()");
    if (!bVar3) goto LAB_00476138;
    *puVar5 = 0;
  }
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x694,"(loop)","loop");
    if (!bVar3) goto LAB_00476138;
    *puVar5 = 0;
  }
  if (loopCount == (LoopCount *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x695,"(loopCount)","loopCount");
    if (!bVar3) goto LAB_00476138;
    *puVar5 = 0;
  }
  if (loop->loopCount != loopCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x696,"(loopCount == loop->loopCount)","loopCount == loop->loopCount");
    if (!bVar3) goto LAB_00476138;
    *puVar5 = 0;
  }
  if (loopCount->hasBeenGenerated == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x697,"(!loopCount->HasBeenGenerated())","!loopCount->HasBeenGenerated()");
    if (!bVar3) goto LAB_00476138;
    *puVar5 = 0;
  }
  bailOutInfo = loop->bailOutInfo;
  if (bailOutInfo == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x69d,"(bailOutInfo)","bailOutInfo");
    if (!bVar3) goto LAB_00476138;
    *puVar5 = 0;
  }
  instr = bailOutInfo->bailOutInstr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x6a0,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) goto LAB_00476138;
    *puVar5 = 0;
  }
  func = bailOutInfo->bailOutFunc;
  iVar4 = LoopCount::Offset(loopCount);
  if (iVar4 == 0) {
    local_38 = (IntConstOpnd *)0x0;
  }
  else {
    iVar4 = LoopCount::Offset(loopCount);
    local_38 = IR::IntConstOpnd::New((long)iVar4,TyInt32,func,true);
  }
  pSVar6 = LoopCount::RightSym(loopCount);
  if (pSVar6 == (StackSym *)0x0) {
    pSVar6 = LoopCount::LeftSym(loopCount);
    if (pSVar6 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x6cd,"(loopCount->LeftSym())","loopCount->LeftSym()");
      if (!bVar3) goto LAB_00476138;
      *puVar5 = 0;
    }
    pSVar6 = LoopCount::LeftSym(loopCount);
  }
  else {
    pBVar7 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Sub_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo,func);
    pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
    IR::Instr::SetSrc2(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((pBVar7->super_Instr).m_src2,true);
    pSVar6 = LoopCount::LeftSym(loopCount);
    if (pSVar6 == (StackSym *)0x0) {
      if (local_38 == (IntConstOpnd *)0x0) {
        (pBVar7->super_Instr).m_opcode = Neg_I4;
        local_38 = (IntConstOpnd *)IR::Instr::UnlinkSrc2(&pBVar7->super_Instr);
      }
      IR::Instr::SetSrc1(&pBVar7->super_Instr,&local_38->super_Opnd);
      local_38 = (IntConstOpnd *)0x0;
    }
    else {
      pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
      IR::Instr::SetSrc1(&pBVar7->super_Instr,&pRVar8->super_Opnd);
      IR::Opnd::SetIsJITOptimizedReg((pBVar7->super_Instr).m_src1,true);
    }
    pSVar6 = StackSym::New(TyInt32,func);
    pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
    IR::Instr::SetDst(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((pBVar7->super_Instr).m_dst,true);
    IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,instr);
    IR::Instr::InsertBefore(instr,&pBVar7->super_Instr);
  }
  if (local_38 != (IntConstOpnd *)0x0) {
    pBVar7 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Add_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo,func);
    pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
    IR::Instr::SetSrc1(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((pBVar7->super_Instr).m_src1,true);
    lVar1 = (local_38->super_EncodableOpnd<long>).m_value;
    if (lVar1 != -0x80000000 && lVar1 < 0) {
      (pBVar7->super_Instr).m_opcode = Sub_I4;
      IR::IntConstOpnd::SetValue(local_38,-lVar1);
    }
    IR::Instr::SetSrc2(&pBVar7->super_Instr,&local_38->super_Opnd);
    pSVar9 = LoopCount::LeftSym(loopCount);
    if (pSVar6 == pSVar9) {
      pSVar6 = StackSym::New(TyInt32,func);
    }
    pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
    IR::Instr::SetDst(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((pBVar7->super_Instr).m_dst,true);
    IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,instr);
    IR::Instr::InsertBefore(instr,&pBVar7->super_Instr);
  }
  iVar4 = LoopCount::MinMagnitudeChange(loopCount);
  if (iVar4 == 1) {
    pSVar9 = LoopCount::LeftSym(loopCount);
    if (pSVar6 == pSVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x703,"(intermediateValueSym != loopCount->LeftSym())",
                         "intermediateValueSym != loopCount->LeftSym()");
      if (!bVar3) {
LAB_00476138:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    this_00 = IR::Instr::New(Div_I4,func);
    pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
    IR::Instr::SetSrc1(this_00,&pRVar8->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg(this_00->m_src1,true);
    if (iVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x6f4,"(minMagnitudeChange != 0)","minMagnitudeChange != 0");
      if (!bVar3) goto LAB_00476138;
      *puVar5 = 0;
    }
    newSrc = IR::IntConstOpnd::New((long)iVar4,TyInt32,func,true);
    IR::Instr::SetSrc2(this_00,&newSrc->super_Opnd);
    pSVar9 = LoopCount::LeftSym(loopCount);
    if (pSVar6 == pSVar9) {
      pSVar6 = StackSym::New(TyInt32,func);
    }
    pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
    IR::Instr::SetDst(this_00,&pRVar8->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg(this_00->m_dst,true);
    IR::Instr::SetByteCodeOffset(this_00,instr);
    IR::Instr::InsertBefore(instr,this_00);
  }
  LoopCount::SetLoopCountMinusOneSym(loopCount,pSVar6);
  return;
}

Assistant:

void GlobOpt::GenerateLoopCount(Loop *const loop, LoopCount *const loopCount)
{
    Assert(DoLoopCountBasedBoundCheckHoist());
    Assert(loop);
    Assert(loopCount);
    Assert(loopCount == loop->loopCount);
    Assert(!loopCount->HasBeenGenerated());

    // loopCountMinusOne = (left - right + offset) / minMagnitudeChange

    // Prepare the landing pad for bailouts and instruction insertion
    BailOutInfo *const bailOutInfo = loop->bailOutInfo;
    Assert(bailOutInfo);
    const IR::BailOutKind bailOutKind = IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck;
    IR::Instr *const insertBeforeInstr = bailOutInfo->bailOutInstr;
    Assert(insertBeforeInstr);
    Func *const func = bailOutInfo->bailOutFunc;

    // intermediateValue = left - right
    IR::IntConstOpnd *offset =
        loopCount->Offset() == 0 ? nullptr : IR::IntConstOpnd::New(loopCount->Offset(), TyInt32, func, true);
    StackSym *const rightSym = loopCount->RightSym();
    StackSym *intermediateValueSym;
    if(rightSym)
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Sub_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc2(IR::RegOpnd::New(rightSym, rightSym->GetType(), func));
        instr->GetSrc2()->SetIsJITOptimizedReg(true);

        StackSym *const leftSym = loopCount->LeftSym();
        if(leftSym)
        {
            // intermediateValue = left - right
            instr->SetSrc1(IR::RegOpnd::New(leftSym, leftSym->GetType(), func));
            instr->GetSrc1()->SetIsJITOptimizedReg(true);
        }
        else if(offset)
        {
            // intermediateValue = offset - right
            instr->SetSrc1(offset);
            offset = nullptr;
        }
        else
        {
            // intermediateValue = -right
            instr->m_opcode = Js::OpCode::Neg_I4;
            instr->SetSrc1(instr->UnlinkSrc2());
        }

        intermediateValueSym = StackSym::New(TyInt32, func);
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
    else
    {
        // intermediateValue = left
        Assert(loopCount->LeftSym());
        intermediateValueSym = loopCount->LeftSym();
    }

    // intermediateValue += offset
    if(offset)
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Add_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        if(offset->GetValue() < 0 && offset->GetValue() != IntConstMin)
        {
            instr->m_opcode = Js::OpCode::Sub_I4;
            offset->SetValue(-offset->GetValue());
        }
        instr->SetSrc2(offset);

        if(intermediateValueSym == loopCount->LeftSym())
        {
            intermediateValueSym = StackSym::New(TyInt32, func);
        }
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }

    // intermediateValue /= minMagnitudeChange
    const int minMagnitudeChange = loopCount->MinMagnitudeChange();
    if(minMagnitudeChange != 1)
    {
        IR::Instr *const instr = IR::Instr::New(Js::OpCode::Div_I4, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        Assert(minMagnitudeChange != 0); // bailout is not needed
        instr->SetSrc2(IR::IntConstOpnd::New(minMagnitudeChange, TyInt32, func, true));

        if(intermediateValueSym == loopCount->LeftSym())
        {
            intermediateValueSym = StackSym::New(TyInt32, func);
        }
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
    else
    {
        Assert(intermediateValueSym != loopCount->LeftSym());
    }

    // loopCountMinusOne = intermediateValue
    loopCount->SetLoopCountMinusOneSym(intermediateValueSym);
}